

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_convert.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  ostream *poVar2;
  int iVar3;
  allocator local_41;
  localization_backend_manager mgr;
  localization_backend_manager local_38 [8];
  string local_30 [32];
  
  booster::locale::localization_backend_manager::global();
  std::__cxx11::string::string(local_30,"posix",&local_41);
  booster::locale::localization_backend_manager::select((string *)&mgr,(uint)local_30);
  std::__cxx11::string::~string(local_30);
  booster::locale::localization_backend_manager::global(local_38);
  booster::locale::localization_backend_manager::~localization_backend_manager(local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing char");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_char<char>();
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing wchar_t");
  std::endl<char,std::char_traits<char>>(poVar2);
  test_char<wchar_t>();
  booster::locale::localization_backend_manager::~localization_backend_manager(&mgr);
  iVar3 = test_counter - error_counter;
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"Passed ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,iVar3);
  poVar2 = std::operator<<(poVar2," tests");
  std::endl<char,std::char_traits<char>>(poVar2);
  if (0 < error_counter) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Failed ");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,error_counter);
    poVar2 = std::operator<<(poVar2," tests");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  poVar2 = std::operator<<((ostream *)&std::cout," ");
  lVar1 = *(long *)poVar2;
  *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 8) = 1;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  poVar2 = std::ostream::_M_insert<double>(((double)iVar3 * 100.0) / (double)test_counter);
  poVar2 = std::operator<<(poVar2,"% of tests completed sucsessefully");
  std::endl<char,std::char_traits<char>>(poVar2);
  return (int)(error_counter != 0);
}

Assistant:

int main()
{
    try {
        booster::locale::localization_backend_manager mgr = booster::locale::localization_backend_manager::global();
        mgr.select("posix");
        booster::locale::localization_backend_manager::global(mgr);

        std::cout << "Testing char" << std::endl;
        test_char<char>();
        std::cout << "Testing wchar_t" << std::endl;
        test_char<wchar_t>();
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    FINALIZE();

}